

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_helpers.hpp
# Opt level: O1

void duckdb::HistogramGenericFunctor::PrepareData
               (Vector *input,idx_t count,Vector *extra_state,UnifiedVectorFormat *result)

{
  duckdb::CreateSortKeyHelpers::CreateSortKey(input,count,(OrderModifiers)0x302,extra_state);
  duckdb::Vector::Flatten((ulong)input);
  duckdb::Vector::Flatten((ulong)extra_state);
  FlatVector::VerifyFlatVector(extra_state);
  FlatVector::VerifyFlatVector(input);
  *(undefined8 *)(extra_state + 0x28) = *(undefined8 *)(input + 0x28);
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(extra_state + 0x30),
             (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(input + 0x30));
  *(undefined8 *)(extra_state + 0x40) = *(undefined8 *)(input + 0x40);
  duckdb::Vector::ToUnifiedFormat((ulong)extra_state,(UnifiedVectorFormat *)count);
  return;
}

Assistant:

static void PrepareData(Vector &input, idx_t count, Vector &extra_state, UnifiedVectorFormat &result) {
		OrderModifiers modifiers(OrderType::ASCENDING, OrderByNullType::NULLS_LAST);
		CreateSortKeyHelpers::CreateSortKey(input, count, modifiers, extra_state);
		input.Flatten(count);
		extra_state.Flatten(count);
		FlatVector::Validity(extra_state).Initialize(FlatVector::Validity(input));
		extra_state.ToUnifiedFormat(count, result);
	}